

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O3

int __thiscall
OB::Parg::parse_args
          (Parg *this,int _argc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_argv)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
  *this_00;
  ulong uVar1;
  char *pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  long *plVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  undefined8 uVar12;
  ulong *puVar13;
  size_type *psVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  pointer __rhs;
  _Alloc_hider _Var16;
  int iVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R13;
  string a;
  string c;
  key_type local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_54;
  string *local_50;
  Parg *local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  if (_argc < 1) {
    iVar17 = 1;
  }
  else {
    local_a8 = &this->flags_;
    local_40 = &(this->flags_)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_00 = &this->data_;
    local_80 = (string *)&this->error_;
    local_38 = &(this->data_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_50 = &this->positional_;
    bVar4 = false;
    iVar17 = 0;
    local_54 = _argc;
    local_48 = this;
    do {
      __rhs = (_argv->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(_argv->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)__rhs >> 5) <=
          (ulong)(long)iVar17) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0010a710:
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",unaff_R13);
LAB_0010a721:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",__rhs
                  );
LAB_0010a732:
        uVar12 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,__rhs);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar12);
      }
      __rhs = __rhs + iVar17;
      if (bVar4) {
        if ((local_48->positional_)._M_string_length == 0) {
          std::__cxx11::string::_M_append((char *)local_50,(ulong)(__rhs->_M_dataplus)._M_p);
        }
        else {
          std::operator+(&local_c8," ",__rhs);
          std::__cxx11::string::_M_append((char *)local_50,(ulong)local_c8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
LAB_00109e3f:
        bVar4 = true;
      }
      else {
        uVar1 = __rhs->_M_string_length;
        if (uVar1 < 2) {
          if (uVar1 == 0) goto LAB_0010a63c;
LAB_00109da1:
          if (local_48->is_positional_ != true) {
LAB_0010a63c:
            std::operator+(&local_e8,"no match for \'",__rhs);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
            psVar14 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_c8.field_2._M_allocated_capacity = *psVar14;
              local_c8.field_2._8_8_ = plVar9[3];
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar14;
              local_c8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_c8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::operator=(local_80,(string *)&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
              return -1;
            }
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            return -1;
          }
          iVar5 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar5 == 0) goto LAB_00109e3f;
          if ((local_48->positional_)._M_string_length == 0) {
            std::__cxx11::string::_M_append((char *)local_50,(ulong)(__rhs->_M_dataplus)._M_p);
          }
          else {
            std::operator+(&local_c8," ",__rhs);
            std::__cxx11::string::_M_append((char *)local_50,(ulong)local_c8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          pcVar2 = (__rhs->_M_dataplus)._M_p;
          if (*pcVar2 != '-') goto LAB_00109da1;
          if (pcVar2[1] == 0x2d) {
            if ((uVar1 == 2) || (pcVar2[1] != '-')) goto LAB_00109da1;
            unaff_R13 = &local_c8;
            std::__cxx11::string::substr((ulong)unaff_R13,(ulong)__rhs);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            local_e8._M_string_length = 0;
            local_e8.field_2._M_allocated_capacity =
                 local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            lVar6 = std::__cxx11::string::find((char *)unaff_R13,0x12a347,0);
            if (lVar6 != -1) {
              std::__cxx11::string::substr((ulong)&local_a0,(ulong)__rhs);
              std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              unaff_R13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (lVar6 + 3);
              std::__cxx11::string::substr((ulong)&local_a0,(ulong)__rhs);
              std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
            }
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                    ::find(&this_00->_M_t,&local_c8);
            if (iVar7._M_node == local_38) {
              unaff_R13 = &local_78;
              std::operator+(unaff_R13,"invalid option \'",__rhs);
              plVar9 = (long *)std::__cxx11::string::append((char *)unaff_R13);
LAB_0010a140:
              puVar13 = (ulong *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar13) {
                local_a0.field_2._M_allocated_capacity = *puVar13;
                local_a0.field_2._8_8_ = plVar9[3];
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              }
              else {
                local_a0.field_2._M_allocated_capacity = *puVar13;
                local_a0._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_a0._M_string_length = plVar9[1];
              *plVar9 = (long)puVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::operator=(local_80,(string *)&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              bVar4 = false;
              iVar5 = iVar17;
            }
            else {
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_00,&local_c8);
              if (pmVar8->seen_ == true) {
                std::operator+(&local_78,"option \'--",&local_c8);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_78);
                goto LAB_0010a140;
              }
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_00,&local_c8);
              if (pmVar8->mode_ == true) {
                if (local_e8._M_string_length == 0) {
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,&local_c8);
                  std::__cxx11::string::_M_replace
                            ((ulong)&pmVar8->value_,0,(char *)(pmVar8->value_)._M_string_length,
                             0x12a25a);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,&local_c8);
                }
                else {
LAB_0010a401:
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,&local_c8);
                  std::__cxx11::string::_M_assign((string *)&pmVar8->value_);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,&local_c8);
                }
                pmVar8->seen_ = true;
                bVar4 = true;
                iVar5 = iVar17;
              }
              else {
                if (local_e8._M_string_length != 0) goto LAB_0010a401;
                iVar5 = iVar17 + 1;
                if (local_54 <= iVar5) {
                  std::operator+(&local_78,"option \'--",&local_c8);
                  plVar9 = (long *)std::__cxx11::string::append((char *)&local_78);
                  goto LAB_0010a140;
                }
                __rhs = (pointer)(long)iVar5;
                pbVar3 = (_argv->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if ((pointer)((long)(_argv->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)
                    <= __rhs) goto LAB_0010a732;
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,&local_c8);
                unaff_R13 = pbVar3 + (long)__rhs;
                std::__cxx11::string::_M_assign((string *)&pmVar8->value_);
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,&local_c8);
                pmVar8->seen_ = true;
                bVar4 = true;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            iVar17 = iVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            local_c8._M_string_length = 1;
            local_c8.field_2._M_local_buf[1] = 0;
            local_c8.field_2._M_local_buf[0] = pcVar2[1];
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find(&local_a8->_M_t,&local_c8);
            if (iVar10._M_node == local_40) {
LAB_00109eba:
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __rhs->_M_string_length;
              bVar4 = true;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1 < pbVar15
                 ) {
                unaff_R13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1
                ;
                do {
                  if (pbVar15 <= unaff_R13) goto LAB_0010a710;
                  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                  local_e8._M_string_length = 1;
                  local_e8.field_2._M_local_buf[1] = 0;
                  local_e8.field_2._M_local_buf[0] =
                       (__rhs->_M_dataplus)._M_p[(long)&(unaff_R13->_M_dataplus)._M_p];
                  iVar10 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::find(&local_a8->_M_t,&local_e8);
                  if (iVar10._M_node == local_40) {
LAB_0010a03f:
                    unaff_R13 = &local_78;
                    std::operator+(unaff_R13,"invalid flag \'",__rhs);
                    plVar9 = (long *)std::__cxx11::string::append((char *)unaff_R13);
LAB_0010a19a:
                    puVar13 = (ulong *)(plVar9 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar9 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar13) {
                      local_a0.field_2._M_allocated_capacity = *puVar13;
                      local_a0.field_2._8_8_ = plVar9[3];
                      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                    }
                    else {
                      local_a0.field_2._M_allocated_capacity = *puVar13;
                      local_a0._M_dataplus._M_p = (pointer)*plVar9;
                    }
                    local_a0._M_string_length = plVar9[1];
                    *plVar9 = (long)puVar13;
                    plVar9[1] = 0;
                    *(undefined1 *)(plVar9 + 2) = 0;
                    std::__cxx11::string::operator=(local_80,(string *)&local_a0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                      operator_delete(local_a0._M_dataplus._M_p,
                                      local_a0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_78._M_dataplus._M_p != &local_78.field_2) {
                      operator_delete(local_78._M_dataplus._M_p,
                                      local_78.field_2._M_allocated_capacity + 1);
                    }
                    uVar12 = local_e8.field_2._M_allocated_capacity;
                    _Var16._M_p = local_e8._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_0010a3c3;
                    goto LAB_0010a3cb;
                  }
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_a8,&local_e8);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,pmVar11);
                  if (pmVar8->mode_ != true) goto LAB_0010a03f;
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_a8,&local_e8);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,pmVar11);
                  if (pmVar8->seen_ == true) {
                    std::operator+(&local_78,"flag \'-",&local_e8);
                    plVar9 = (long *)std::__cxx11::string::append((char *)&local_78);
                    goto LAB_0010a19a;
                  }
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_a8,&local_e8);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,pmVar11);
                  std::__cxx11::string::_M_replace
                            ((ulong)&pmVar8->value_,0,(char *)(pmVar8->value_)._M_string_length,
                             0x12a25a);
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_a8,&local_e8);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,pmVar11);
                  pmVar8->seen_ = true;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  unaff_R13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(unaff_R13->_M_dataplus)._M_p + 1);
                  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __rhs->_M_string_length;
                } while (unaff_R13 < pbVar15);
              }
            }
            else {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at(local_a8,&local_c8);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_00,pmVar11);
              if (pmVar8->mode_ != false) goto LAB_00109eba;
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at(local_a8,&local_c8);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                       ::at(this_00,pmVar11);
              if (pmVar8->seen_ == true) {
                std::operator+(&local_a0,"flag \'-",&local_c8);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_a0);
LAB_0010a343:
                puVar13 = (ulong *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar13) {
                  local_e8.field_2._M_allocated_capacity = *puVar13;
                  local_e8.field_2._8_8_ = plVar9[3];
                  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                }
                else {
                  local_e8.field_2._M_allocated_capacity = *puVar13;
                  local_e8._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_e8._M_string_length = plVar9[1];
                *plVar9 = (long)puVar13;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::__cxx11::string::operator=(local_80,(string *)&local_e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                uVar12 = local_a0.field_2._M_allocated_capacity;
                _Var16._M_p = local_a0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
LAB_0010a3c3:
                  operator_delete(_Var16._M_p,uVar12 + 1);
                }
LAB_0010a3cb:
                bVar4 = false;
              }
              else if (__rhs->_M_string_length < 3) {
LAB_0010a08e:
                iVar5 = iVar17 + 1;
                if (local_54 <= iVar5) {
                  std::operator+(&local_a0,"flag \'-",&local_c8);
                  plVar9 = (long *)std::__cxx11::string::append((char *)&local_a0);
                  goto LAB_0010a343;
                }
                __rhs = (pointer)(long)iVar5;
                pbVar3 = (_argv->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if ((pointer)((long)(_argv->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5)
                    <= __rhs) goto LAB_0010a721;
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::at(local_a8,&local_c8);
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,pmVar11);
                unaff_R13 = pbVar3 + (long)__rhs;
                std::__cxx11::string::_M_assign((string *)&pmVar8->value_);
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::at(local_a8,&local_c8);
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                         ::at(this_00,pmVar11);
                pmVar8->seen_ = true;
                bVar4 = true;
                iVar17 = iVar5;
              }
              else {
                if ((__rhs->_M_dataplus)._M_p[2] == '=') {
                  if (__rhs->_M_string_length == 3) goto LAB_0010a08e;
                  std::__cxx11::string::substr((ulong)&local_e8,(ulong)__rhs);
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_a8,&local_c8);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,pmVar11);
                  std::__cxx11::string::operator=((string *)&pmVar8->value_,(string *)&local_e8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_a8,&local_c8);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,pmVar11);
                }
                else {
                  std::__cxx11::string::substr((ulong)&local_e8,(ulong)__rhs);
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_a8,&local_c8);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,pmVar11);
                  std::__cxx11::string::operator=((string *)&pmVar8->value_,(string *)&local_e8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::at(local_a8,&local_c8);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                           ::at(this_00,pmVar11);
                }
                pmVar8->seen_ = true;
                bVar4 = true;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
          }
          if (!bVar4) {
            return -1;
          }
        }
        bVar4 = false;
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < local_54);
    iVar17 = 0;
  }
  return iVar17;
}

Assistant:

int parse_args(int _argc, std::vector<std::string> _argv)
  {
    if (_argc < 1) return 1;

    bool dashdash {false};

    // loop through arg vector
    for (int i = 0; i < _argc; ++i)
    {
      std::string const& tmp {_argv.at(static_cast<size_t>(i))};
      // std::cout << "ARG: " << i << " -> " << tmp << std::endl;

      if (dashdash)
      {
        if (positional_.size() == 0)
        {
          positional_.append(tmp);
        }
        else
        {
          positional_.append(" " + tmp);
        }
        continue;
      }

      if (tmp.size() > 1 && tmp.at(0) == '-' && tmp.at(1) != '-')
      {
        // short
        // std::cout << "SHORT: " << tmp << std::endl;

        std::string c {tmp.at(1)};
        if (flags_.find(c) != flags_.end() && !(data_.at(flags_.at(c)).mode_))
        {
          // short arg
          // std::cout << "SHORT: arg -> " << c << std::endl;

          if (data_.at(flags_.at(c)).seen_)
          {
            // error
            error_ = "flag '-" + c + "' has already been seen";
            return -1;
          }

          if (tmp.size() > 2 && tmp.at(2) != '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(2, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (tmp.size() > 3 && tmp.at(2) == '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(3, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (i + 1 < _argc)
          {
            data_.at(flags_.at(c)).value_ = _argv.at(static_cast<size_t>(i + 1));
            data_.at(flags_.at(c)).seen_ = true;
            ++i;
          }
          else
          {
            // error
            error_ = "flag '-" + c + "' requires an arg";
            return -1;
          }
        }
        else
        {
          // short mode
          for (size_t j = 1; j < tmp.size(); ++j)
          {
            std::string s {tmp.at(j)};

            if (flags_.find(s) != flags_.end() && data_.at(flags_.at(s)).mode_)
            {
              // std::cout << "SHORT: mode -> " << c << std::endl;

              if (data_.at(flags_.at(s)).seen_)
              {
                // error
                error_ = "flag '-" + s + "' has already been seen";
                return -1;
              }

              data_.at(flags_.at(s)).value_ = "1";
              data_.at(flags_.at(s)).seen_ = true;
            }
            else
            {
              // error
              error_ = "invalid flag '" + tmp + "'";
              return -1;
            }
          }
        }
      }
      else if (tmp.size() > 2 && tmp.at(0) == '-' && tmp.at(1) == '-')
      {
        // long || --
        // std::cout << "LONG: " << tmp << std::endl;
        std::string c {tmp.substr(2, tmp.size() - 1)};
        std::string a;

        auto const delim = c.find("=");
        if (delim != std::string::npos)
        {
          c = tmp.substr(2, delim);
          a = tmp.substr(3 + delim, tmp.size() - 1);
        }

        if (data_.find(c) != data_.end())
        {
          if (data_.at(c).seen_)
          {
            // error
            error_ = "option '--" + c + "' has already been seen";
            return -1;
          }

          if (data_.at(c).mode_ && a.size() == 0)
          {
            // std::cout << "LONG: mode -> " << c << std::endl;
            data_.at(c).value_ = "1";
            data_.at(c).seen_ = true;
          }
          else
          {
            // std::cout << "LONG: arg -> " << c << std::endl;
            if (a.size() > 0)
            {
              data_.at(c).value_ = a;
              data_.at(c).seen_ = true;
            }
            else if (i + 1 < _argc)
            {
              data_.at(c).value_ = _argv.at(static_cast<size_t>(i + 1));
              data_.at(c).seen_ = true;
              ++i;
            }
            else
            {
              // error
              error_ = "option '--" + c + "' requires an arg";
              return -1;
            }
          }
        }
        else
        {
          // error
          error_ = "invalid option '" + tmp + "'";
          return -1;
        }
      }
      else if (tmp.size() > 0 && is_positional_)
      {
        // positional
        // std::cout << "POS: " << tmp << std::endl;
        if (tmp == "--")
        {
          dashdash = true;
        }
        else
        {
          if (positional_.size() == 0)
          {
            positional_.append(tmp);
          }
          else
          {
            positional_.append(" " + tmp);
          }
        }
      }
      else
      {
        // error
        error_ = "no match for '" + tmp + "'";
        return -1;
      }
    }

    return 0;
  }